

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O3

int match_tables(ip_tables_t *ipts,packet_t *pkt,ip_opt_t *opt)

{
  ip_chain_t *piVar1;
  uint uVar2;
  int iVar3;
  ip_opt_t *piVar4;
  int j;
  long lVar5;
  ulong uVar6;
  list_head *plVar7;
  bool bVar8;
  double in_XMM0_Qa;
  
  if (ipts == (ip_tables_t *)0x0 || pkt == (packet_t *)0x0) {
    _log(in_XMM0_Qa);
    iVar3 = 6;
  }
  else {
    piVar4 = &default_opt;
    if (opt != (ip_opt_t *)0x0) {
      piVar4 = opt;
    }
    uVar6 = 0;
    bVar8 = false;
    do {
      lVar5 = 0;
      do {
        if (((piVar4->list[lVar5][uVar6] != '\0') && (ipts->tables[lVar5] != (ip_table_t *)0x0)) &&
           (piVar1 = ipts->tables[lVar5]->chains[uVar6], piVar1 != (ip_chain_t *)0x0)) {
          plVar7 = &piVar1->rules;
          do {
            plVar7 = plVar7->next;
            if (plVar7 == &piVar1->rules) {
LAB_00104861:
              uVar2 = piVar1->policy;
              break;
            }
            uVar2 = match_rule((ip_rule_t *)(plVar7 + -5),pkt);
            if (uVar2 == 3) goto LAB_00104861;
          } while (2 < uVar2);
          if (uVar2 == 0) {
            return (uint)bVar8;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      bVar8 = 3 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 5);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int match_tables(ip_tables_t *ipts, packet_t *pkt, ip_opt_t *opt)
{
	if (ipts == NULL || pkt == NULL) {
		log_err("%s ipts or pkt is null\n", __FUNCTION__);
		return TARGET_NONE;
	}

	if (opt == NULL) {
		opt = &default_opt;
	}

	int target = TARGET_NONE;

	for (int i = 0; i < CHAIN_MAX; i++) {

		for (int j = 0; j < TABLE_MAX; j++) {

			if (opt->list[j][i] == 0 || ipts->tables[j] == NULL || ipts->tables[j]->chains[i] == NULL) {
				continue;
			}

			target = match_chain(ipts->tables[j]->chains[i], pkt);

			if (target == TARGET_DROP) {
				return TARGET_DROP;
			}
		}
	}
	return TARGET_ACCEPT;
}